

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O1

TestStatus *
vkt::geometry::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,TestParams_conflict params)

{
  pointer pcVar1;
  void **this;
  VkImageCreateFlags *pVVar2;
  pointer pbVar3;
  pointer pbVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  TestLog *log;
  void *pvVar6;
  VkImageSubresourceRange subresourceRange;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  VkImageViewType viewType;
  deUint32 queueFamilyIndex;
  int iVar12;
  VkResult result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  DeviceInterface *vk;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat TVar15;
  const_iterator cVar16;
  ostream *this_00;
  ulong uVar17;
  NotSupportedError *this_01;
  VkSampleCountFlagBits *pVVar18;
  VkImageType *pVVar19;
  long lVar20;
  void **ppvVar21;
  uint uVar22;
  uint uVar23;
  char *pcVar24;
  VkPipelineMultisampleStateCreateInfo *image;
  VkImageCreateInfo *image_00;
  deUint32 dVar25;
  float rowWidthRatio;
  undefined4 uVar26;
  VkRect2D scissor;
  Vec4 layerColor;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  VkAttachmentReference colorAttachmentRef;
  void *local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  VkPipelineColorBlendAttachmentState *local_660;
  float local_658 [4];
  VkImage local_648;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_640;
  VkImageCreateInfo imageParams;
  deUint64 local_5b0;
  char *local_5a8;
  undefined8 local_5a0;
  VkRenderPass local_4a8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_4a0;
  VkBuffer local_488;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_480;
  ConstPixelBufferAccess layerImage;
  VkViewport viewport;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_3f0;
  VkPipelineLayout local_3d8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_3d0;
  VkFramebuffer local_3b8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_3b0;
  VkShaderModule local_398;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_390;
  VkShaderModule local_378;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_370;
  VkShaderModule local_358;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_350;
  VkImageView local_338;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_330;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkAttachmentDescription colorAttachmentDescription;
  VkBool32 VStack_29c;
  Vec4 white;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  undefined1 local_1b8 [20];
  VkSampleCountFlagBits aVStack_1a4 [3];
  VkPipelineVertexInputStateCreateInfo *local_198;
  VkImageCreateInfo *local_190;
  VkPipelineTessellationStateCreateInfo *local_188;
  VkPipelineViewportStateCreateInfo *local_180;
  VkPipelineRasterizationStateCreateInfo *local_178;
  VkPipelineMultisampleStateCreateInfo *local_170;
  VkPipelineDepthStencilStateCreateInfo *local_168;
  VkPipelineColorBlendStateCreateInfo *local_160;
  VkPipelineDynamicStateCreateInfo *local_158;
  VkPipelineLayout local_150;
  VkRenderPass local_148;
  deUint32 local_140;
  VkPipeline local_138;
  deInt32 local_130;
  VkClearValue clearValue;
  
  uVar22 = 0;
  viewType = params.image.viewType;
  if ((ulong)params.image.viewType == 2) {
    pvVar13 = Context::getDeviceExtensions_abi_cxx11_(context);
    pbVar3 = (pvVar13->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar13 = Context::getDeviceExtensions_abi_cxx11_(context);
    pbVar4 = (pvVar13->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                       (pbVar3,pbVar4,"VK_KHR_maintenance1");
    if (_Var14._M_current == pbVar4) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                 ,0x381);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    uVar22 = 0x20;
    viewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
  }
  vk = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  queue = Context::getUniversalQueue(context);
  allocator = Context::getDefaultAllocator(context);
  checkGeometryShaderSupport(vki,physDevice,0);
  dVar25 = params.image.numLayers;
  if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
    dVar25 = params.image.size.depth;
  }
  TVar15 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar12 = tcu::getPixelSize(TVar15);
  imageParams.imageType = VK_IMAGE_TYPE_LAST;
  if (params.image.viewType < VK_IMAGE_VIEW_TYPE_LAST) {
    imageParams.imageType = *(VkImageType *)(&DAT_00b9f564 + (ulong)params.image.viewType * 4);
  }
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags =
       (uint)(params.image.viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY ||
             params.image.viewType == VK_IMAGE_VIEW_TYPE_CUBE) << 4 | uVar22;
  imageParams.format = VK_FORMAT_R8G8B8A8_UNORM;
  imageParams.extent.depth = params.image.size.depth;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = params.image.numLayers;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams._64_8_ = imageParams._64_8_ & 0xffffffff00000000;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams._80_8_ = imageParams._80_8_ & 0xffffffff00000000;
  imageParams.extent.width = params.image.size.width;
  imageParams.extent.height = params.image.size.height;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_1b8,vk,device,&imageParams,
                    (VkAllocationCallbacks *)0x0);
  uVar8 = local_1b8._0_8_;
  DStack_640.m_device = (VkDevice)stack0xfffffffffffffe58;
  DStack_640.m_allocator = (VkAllocationCallbacks *)aVStack_1a4._4_8_;
  local_648.m_internal = local_1b8._0_8_;
  DStack_640.m_deviceIface = (DeviceInterface *)local_1b8._8_8_;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (DeviceInterface *)0x0;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,device,
            allocator,(VkImage)uVar8,(MemoryRequirement)0x0);
  uVar8 = imageParams._0_8_;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar25;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&imageParams,vk,device,local_648,viewType,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  uVar17 = (ulong)(params.image.numLayers * params.image.size.depth * params.image.size.width *
                   params.image.size.height * iVar12);
  DStack_330.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  DStack_330.m_device = (VkDevice)imageParams._16_8_;
  local_338.m_internal = imageParams._0_8_;
  DStack_330.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  makeBufferCreateInfo((VkBufferCreateInfo *)&imageParams,uVar17,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1b8,vk,device,
                     (VkBufferCreateInfo *)&imageParams,(VkAllocationCallbacks *)0x0);
  uVar9 = local_1b8._0_8_;
  DStack_480.m_device = (VkDevice)stack0xfffffffffffffe58;
  DStack_480.m_allocator = (VkAllocationCallbacks *)aVStack_1a4._4_8_;
  local_488.m_internal = local_1b8._0_8_;
  DStack_480.m_deviceIface = (DeviceInterface *)local_1b8._8_8_;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (DeviceInterface *)0x0;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,device,
             allocator,(VkBuffer)uVar9,(MemoryRequirement)0x1);
  uVar9 = imageParams._0_8_;
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  pcVar1 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"vert","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,
             *(ProgramBinary **)(cVar16._M_node + 2),0);
  DStack_350.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  DStack_350.m_device = (VkDevice)imageParams._16_8_;
  local_358.m_internal = imageParams._0_8_;
  DStack_350.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(stack0xfffffffffffffe58 + 1));
  }
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"geom","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,
             *(ProgramBinary **)(cVar16._M_node + 2),0);
  DStack_370.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  DStack_370.m_device = (VkDevice)imageParams._16_8_;
  local_378.m_internal = imageParams._0_8_;
  DStack_370.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(stack0xfffffffffffffe58 + 1));
  }
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"frag","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,
             *(ProgramBinary **)(cVar16._M_node + 2),0);
  DStack_390.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  DStack_390.m_device = (VkDevice)imageParams._16_8_;
  local_398.m_internal = imageParams._0_8_;
  DStack_390.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(stack0xfffffffffffffe58 + 1));
  }
  aVStack_1a4._4_8_ = &colorAttachmentDescription;
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_R8G8B8A8_UNORM;
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  stack0xfffffffffffffd60 = (PFN_vkInternalAllocationNotification)CONCAT44(VStack_29c,2);
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_1b8._8_8_ = (DeviceInterface *)0x0;
  stack0xfffffffffffffe58 = (VkDevice)0x100000000;
  local_198 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_198._4_4_,1);
  local_188 = (VkPipelineTessellationStateCreateInfo *)((ulong)local_188 & 0xffffffff00000000);
  local_180 = (VkPipelineViewportStateCreateInfo *)0x0;
  local_190 = &imageParams;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo,vk,device,
             (VkRenderPassCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  local_4a8.m_internal._4_4_ = pipelineRasterizationStateInfo._4_4_;
  local_4a8.m_internal._0_4_ = pipelineRasterizationStateInfo.sType;
  DStack_4a0.m_device = (VkDevice)pipelineRasterizationStateInfo._16_8_;
  DStack_4a0.m_allocator = (VkAllocationCallbacks *)pipelineRasterizationStateInfo._24_8_;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&imageParams,vk,device,local_4a8,
                  local_338,params.image.size.width,params.image.size.height,dVar25);
  DStack_3b0.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  DStack_3b0.m_device = (VkDevice)imageParams._16_8_;
  local_3b8.m_internal = imageParams._0_8_;
  DStack_3b0.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&imageParams,vk,device,
                     (VkDescriptorSetLayout)0x0);
  DStack_3d0.m_device = (VkDevice)imageParams._16_8_;
  DStack_3d0.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  local_3d8.m_internal = imageParams._0_8_;
  DStack_3d0.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  pipelineViewportStateInfo.pViewports = &viewport;
  viewport.x = 0.0;
  viewport.y = 0.0;
  viewport.height = (float)params.image.size.height;
  viewport.width = (float)params.image.size.width;
  local_660 = &pipelineColorBlendAttachmentState;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 1.0;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  local_180 = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.scissorCount = 1;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.pNext._0_4_ = 0;
  pipelineRasterizationStateInfo.pNext._4_4_ = 0;
  pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
  pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_170 = &pipelineMultisampleStateInfo;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  colorAttachmentDescription.flags = 0x19;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_GENERAL;
  pipelineRasterizationStateInfo.lineWidth = 1.0;
  pipelineRasterizationStateInfo._60_4_ = 0;
  stack0xfffffffffffffd60 = (PFN_vkInternalAllocationNotification)0x0;
  colorAttachmentRef.attachment = 0x1a;
  local_678 = (void *)0x0;
  uStack_670 = 0;
  local_668._0_4_ = VK_FORMAT_B4G4R4A4_UNORM_PACK16;
  local_668._4_4_ = 1;
  imageParams.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = (VkFormat)local_358.m_internal;
  imageParams.extent.width = (deUint32)(local_358.m_internal >> 0x20);
  imageParams.extent.height = 0xb1c325;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_2_BIT;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 8;
  imageParams.pQueueFamilyIndices = (deUint32 *)local_378.m_internal;
  imageParams._80_8_ = (long)"pre_main" + 4;
  local_5b0 = local_398.m_internal;
  local_5a8 = "main";
  local_1b8._0_4_ = sBGR|sR;
  local_1b8._8_8_ = (DeviceInterface *)0x0;
  stack0xfffffffffffffe58 = (VkDevice)0x300000000;
  local_198 = &vertexInputStateInfo;
  local_190 = (VkImageCreateInfo *)&pipelineInputAssemblyStateInfo;
  local_188 = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_178 = &pipelineRasterizationStateInfo;
  local_168 = (VkPipelineDepthStencilStateCreateInfo *)&colorAttachmentDescription;
  local_160 = (VkPipelineColorBlendStateCreateInfo *)&colorAttachmentRef;
  local_158 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_150.m_internal = local_3d8.m_internal;
  local_148.m_internal = local_4a8.m_internal;
  local_5a0 = 0;
  local_140 = 0;
  local_138.m_internal = 0;
  local_130 = 0;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.vertexAttributeDescriptionCount = 0;
  vertexInputStateInfo._36_4_ = 0;
  vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 0;
  vertexInputStateInfo.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo.flags = 0;
  pipelineInputAssemblyStateInfo.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  local_658[0] = 0.0;
  local_658[1] = 0.0;
  local_658[2] = 0.0;
  local_658[3] = 0.0;
  scissor.extent = params.image.size._0_8_;
  aVStack_1a4._4_8_ = &imageParams;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&layerImage,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  TVar15 = layerImage.m_format;
  DStack_3f0.m_deviceIface = (DeviceInterface *)layerImage.m_size.m_data._0_8_;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&imageParams,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  viewport.minDepth = (float)imageParams.flags;
  viewport.maxDepth = (float)imageParams.imageType;
  viewport.x = (float)imageParams.sType;
  viewport.y = (float)imageParams._4_4_;
  viewport._8_8_ = imageParams.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&imageParams,vk,device,
             (VkCommandPool)imageParams._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar10 = imageParams._16_8_;
  uVar7 = CONCAT44(imageParams.extent.width,imageParams.format);
  scissor.offset.x = imageParams.sType;
  scissor.offset.y = imageParams._4_4_;
  scissor.extent = (VkExtent2D)imageParams.pNext;
  zeroBuffer(vk,device,(Allocation *)uVar9,uVar17);
  beginCommandBuffer(vk,(VkCommandBuffer)scissor.offset);
  clearValue._0_4_ = 0.0;
  clearValue._4_4_ = 0;
  clearValue._8_8_ = 0x3f80000000000000;
  colorAttachmentDescription.flags = 0x2b;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = (VkStructureType)local_4a8.m_internal;
  colorAttachmentDescription.stencilLoadOp = local_4a8.m_internal._4_4_;
  colorAttachmentDescription.stencilStoreOp = (undefined4)local_3b8.m_internal;
  colorAttachmentDescription.initialLayout = local_3b8.m_internal._4_4_;
  stack0xfffffffffffffd60 = (PFN_vkInternalAllocationNotification)0x0;
  (*vk->_vptr_DeviceInterface[0x74])(vk,scissor.offset,&colorAttachmentDescription,0);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,scissor.offset,0,TVar15);
  (*vk->_vptr_DeviceInterface[0x59])(vk,scissor.offset,1,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,scissor.offset);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x100;
  imageParams.imageType = 0x800;
  imageParams.format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  imageParams.extent.width = 6;
  imageParams.extent.height = 0xffffffff;
  imageParams.extent.depth = 0xffffffff;
  imageParams.mipLevels = (deUint32)local_648.m_internal;
  imageParams.arrayLayers = (deUint32)(local_648.m_internal >> 0x20);
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 1;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = params.image.numLayers;
  uVar26 = SUB84(&imageParams,0);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,scissor.offset,0x400,0x1000,0,0,0,0,0,1,uVar26);
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 1;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = params.image.numLayers;
  imageParams.extent.height = 0;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  imageParams.tiling = params.image.size.depth;
  imageParams.arrayLayers = params.image.size.width;
  imageParams.samples = params.image.size.height;
  (*vk->_vptr_DeviceInterface[99])
            (vk,scissor.offset,local_648.m_internal,6,local_488.m_internal,1,uVar26);
  imageParams.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x1000;
  imageParams.imageType = 0x2000;
  imageParams.format = ~VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0xffffffff;
  imageParams.extent.height = (deUint32)local_488.m_internal;
  imageParams.extent.depth = (deUint32)(local_488.m_internal >> 0x20);
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0xffffffff;
  imageParams.tiling = ~VK_IMAGE_TILING_OPTIMAL;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,scissor.offset,0x1000,0x4000,0,0,0,1,&imageParams,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,scissor.offset);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                    ,0x3fc);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)scissor.offset);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar9 + 8),*(VkDeviceSize *)(uVar9 + 0x10),
             uVar17);
  log = context->m_testCtx->m_log;
  pvVar6 = *(void **)(uVar9 + 0x18);
  if ((0x11U >> ((byte)params.image.viewType & 0x1f) &
      params.image.viewType < VK_IMAGE_VIEW_TYPE_LAST) == 1) {
    pipelineRasterizationStateInfo.sType = params.image.size.width;
    pipelineRasterizationStateInfo._4_4_ = 1;
    pipelineRasterizationStateInfo.pNext._0_4_ = 1;
    pipelineRasterizationStateInfo.pNext._4_4_ = params.image.numLayers;
    imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
               (TextureFormat *)&imageParams,params.image.size.width,params.image.numLayers,1,pvVar6
              );
  }
  else {
    if ((4U >> ((byte)params.image.viewType & 0x1f) & 1) == 0) {
      params.image.size.depth = params.image.numLayers;
    }
    pipelineRasterizationStateInfo.sType = params.image.size.width;
    pipelineRasterizationStateInfo._4_4_ = params.image.size.height;
    pipelineRasterizationStateInfo.pNext._0_4_ = 0;
    if (VK_IMAGE_VIEW_TYPE_CUBE_ARRAY < params.image.viewType) {
      params.image.size.depth = params.image.numLayers;
    }
    pipelineRasterizationStateInfo.pNext._4_4_ = params.image.size.depth;
    imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
               (TextureFormat *)&imageParams,params.image.size.width,params.image.size.height,
               params.image.size.depth,pvVar6);
  }
  if ((int)pipelineRasterizationStateInfo.pNext._4_4_ < 1) {
    dVar25 = 0;
  }
  else {
    this = &imageParams.pNext;
    iVar12 = 0;
    uVar22 = 0;
    dVar25 = 0;
    do {
      tcu::getSubregion(&layerImage,(ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
                        0,(uint)pipelineRasterizationStateInfo.pNext * uVar22,
                        (~(uint)pipelineRasterizationStateInfo.pNext & 1) * uVar22,
                        pipelineRasterizationStateInfo.sType,pipelineRasterizationStateInfo._4_4_,1)
      ;
      imageParams._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Verifying ",10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
        lVar20 = 10;
        pcVar24 = "slice z = ";
LAB_00a0c0d3:
        this_00 = (ostream *)local_1b8;
        std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar24,lVar20);
        uVar23 = uVar22;
      }
      else {
        if ((params.image.viewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) &&
           (params.image.viewType != VK_IMAGE_VIEW_TYPE_CUBE)) {
          lVar20 = 6;
          pcVar24 = "layer ";
          goto LAB_00a0c0d3;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"cube ",5);
        this_00 = (ostream *)std::ostream::operator<<(local_1b8,uVar22 / 6);
        std::__ostream_insert<char,std::char_traits<char>>(this_00,", face ",7);
        uVar23 = uVar22 % 6;
      }
      std::ostream::operator<<(this_00,uVar23);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)&local_148);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(char *)colorAttachmentRef,(long)local_678);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&imageParams,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (colorAttachmentRef != (VkAttachmentReference)&uStack_670) {
        operator_delete((void *)colorAttachmentRef,uStack_670 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      std::ios_base::~ios_base((ios_base *)&local_5b0);
      pvVar6 = layerImage.m_data;
      white.m_data[0] = 1.0;
      white.m_data[1] = 1.0;
      white.m_data[2] = 1.0;
      white.m_data[3] = 1.0;
      if (TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION < params.testType) {
        bVar11 = false;
        goto LAB_00a0c485;
      }
      image_00 = &imageParams;
      switch(params.testType) {
      case TEST_TYPE_DEFAULT_LAYER:
        if (uVar22 == 0) {
          imageParams.sType = layerImage.m_format.order;
          imageParams._4_4_ = layerImage.m_format.type;
          pVVar19 = &imageParams.imageType;
          ppvVar21 = this;
          goto LAB_00a0c444;
        }
        local_1b8._0_4_ = layerImage.m_format.order;
        local_1b8._4_4_ = layerImage.m_format.type;
        ppvVar21 = (void **)(local_1b8 + 8);
        pVVar18 = aVStack_1a4;
        image = (VkPipelineMultisampleStateCreateInfo *)local_1b8;
LAB_00a0c3fb:
        *(int *)(ppvVar21 + 1) = layerImage.m_size.m_data[2];
        *ppvVar21 = (void *)layerImage.m_size.m_data._0_8_;
        pVVar18[2] = layerImage.m_pitch.m_data[2];
        *(ulong *)pVVar18 = CONCAT44(layerImage.m_pitch.m_data[1],layerImage.m_pitch.m_data[0]);
        image->pSampleMask = (VkSampleMask *)layerImage.m_data;
        bVar11 = verifyEmptyImage(log,(ConstPixelBufferAccess *)image);
        break;
      case TEST_TYPE_SINGLE_LAYER:
        if (uVar22 != (int)pipelineRasterizationStateInfo.pNext._4_4_ / 2) {
          vertexInputStateInfo.sType = layerImage.m_format.order;
          vertexInputStateInfo._4_4_ = layerImage.m_format.type;
          ppvVar21 = &vertexInputStateInfo.pNext;
          pVVar18 = &vertexInputStateInfo.vertexBindingDescriptionCount;
          image = (VkPipelineMultisampleStateCreateInfo *)&vertexInputStateInfo;
          goto LAB_00a0c3fb;
        }
        colorAttachmentRef.attachment = layerImage.m_format.order;
        colorAttachmentRef.layout = layerImage.m_format.type;
        pVVar19 = (VkImageType *)((long)&uStack_670 + 4);
        image_00 = (VkImageCreateInfo *)&colorAttachmentRef;
        ppvVar21 = &local_678;
LAB_00a0c444:
        rowWidthRatio = 0.5;
        goto LAB_00a0c44c;
      default:
        pipelineViewportStateInfo.sType = layerImage.m_format.order;
        pipelineViewportStateInfo._4_4_ = layerImage.m_format.type;
        pipelineViewportStateInfo.flags = layerImage.m_size.m_data[2];
        pipelineViewportStateInfo.pNext = (void *)layerImage.m_size.m_data._0_8_;
        pipelineViewportStateInfo.pViewports._4_4_ = layerImage.m_pitch.m_data[2];
        pipelineViewportStateInfo.viewportCount = layerImage.m_pitch.m_data[0];
        pipelineViewportStateInfo.pViewports._0_4_ = layerImage.m_pitch.m_data[1];
        pipelineViewportStateInfo._32_8_ = layerImage.m_data;
        uVar17 = (ulong)(iVar12 + (uVar22 / 6) * -0x60);
        layerColor.m_data._0_8_ =
             *(undefined8 *)(geometry::(anonymous_namespace)::s_colors + uVar17);
        layerColor.m_data._8_8_ =
             *(undefined8 *)(geometry::(anonymous_namespace)::s_colors + uVar17 + 8);
        bVar11 = verifyImageSingleColoredRow
                           (log,(ConstPixelBufferAccess *)&pipelineViewportStateInfo,0.5,&layerColor
                           );
        break;
      case TEST_TYPE_DIFFERENT_CONTENT:
      case TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION:
        if (uVar22 == 0) {
          pipelineMultisampleStateInfo.sType = layerImage.m_format.order;
          pipelineMultisampleStateInfo._4_4_ = layerImage.m_format.type;
          ppvVar21 = &pipelineMultisampleStateInfo.pNext;
          pVVar18 = &pipelineMultisampleStateInfo.rasterizationSamples;
          image = &pipelineMultisampleStateInfo;
          goto LAB_00a0c3fb;
        }
        rowWidthRatio = (float)(int)uVar22 / (float)(int)pipelineRasterizationStateInfo.pNext._4_4_;
        pipelineInputAssemblyStateInfo.sType = layerImage.m_format.order;
        pipelineInputAssemblyStateInfo._4_4_ = layerImage.m_format.type;
        ppvVar21 = &pipelineInputAssemblyStateInfo.pNext;
        pVVar19 = &pipelineInputAssemblyStateInfo.topology;
        image_00 = (VkImageCreateInfo *)&pipelineInputAssemblyStateInfo;
LAB_00a0c44c:
        *(int *)(ppvVar21 + 1) = layerImage.m_size.m_data[2];
        *ppvVar21 = (void *)layerImage.m_size.m_data._0_8_;
        ((VkExtent3D *)(pVVar19 + 2))->width = layerImage.m_pitch.m_data[2];
        *(ulong *)pVVar19 = CONCAT44(layerImage.m_pitch.m_data[1],layerImage.m_pitch.m_data[0]);
        *(void **)&(image_00->extent).height = pvVar6;
        bVar11 = verifyImageSingleColoredRow
                           (log,(ConstPixelBufferAccess *)image_00,rowWidthRatio,&white);
        break;
      case TEST_TYPE_LAYER_ID:
        layerColor.m_data[0] = 0.5;
        if ((uVar22 & 1) != 0) {
          layerColor.m_data[0] = 1.0;
        }
        layerColor.m_data[1] = 0.5;
        if ((uVar22 & 2) != 0) {
          layerColor.m_data[1] = 1.0;
        }
        layerColor.m_data[2] = 1.0;
        if (uVar22 != 0) {
          layerColor.m_data[2] = 0.0;
        }
        layerColor.m_data[3] = 1.0;
        pipelineColorBlendAttachmentState.blendEnable = layerImage.m_format.order;
        pipelineColorBlendAttachmentState.srcColorBlendFactor = layerImage.m_format.type;
        pipelineColorBlendAttachmentState.srcAlphaBlendFactor = layerImage.m_size.m_data[2];
        pipelineColorBlendAttachmentState.dstColorBlendFactor = layerImage.m_size.m_data[0];
        pipelineColorBlendAttachmentState.colorBlendOp = layerImage.m_size.m_data[1];
        pipelineColorBlendAttachmentState.colorWriteMask = layerImage.m_pitch.m_data[2];
        pipelineColorBlendAttachmentState.dstAlphaBlendFactor = layerImage.m_pitch.m_data[0];
        pipelineColorBlendAttachmentState.alphaBlendOp = layerImage.m_pitch.m_data[1];
        bVar11 = verifyImageSingleColoredRow
                           (log,(ConstPixelBufferAccess *)&pipelineColorBlendAttachmentState,0.5,
                            &layerColor);
      }
LAB_00a0c485:
      dVar25 = dVar25 + bVar11;
      uVar22 = uVar22 + 1;
      iVar12 = iVar12 + 0x10;
    } while ((int)uVar22 < (int)pipelineRasterizationStateInfo.pNext._4_4_);
  }
  pVVar2 = &imageParams.flags;
  imageParams._0_8_ = pVVar2;
  if (dVar25 == pipelineRasterizationStateInfo.pNext._4_4_) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&imageParams,"OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,imageParams._0_8_,
               (long)imageParams.pNext + imageParams._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&imageParams,"Rendered images are incorrect","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,imageParams._0_8_,
               (long)imageParams.pNext + imageParams._0_8_);
  }
  if ((VkImageCreateFlags *)imageParams._0_8_ != pVVar2) {
    operator_delete((void *)imageParams._0_8_,imageParams._16_8_ + 1);
  }
  if (scissor.offset != (VkOffset2D)0x0) {
    imageParams.sType = scissor.offset.x;
    imageParams._4_4_ = scissor.offset.y;
    (**(code **)(*(long *)scissor.extent + 0x240))(scissor.extent,uVar10,uVar7,1);
  }
  if (viewport._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&viewport.width,
               (VkCommandPool)viewport._0_8_);
  }
  if (TVar15 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_3f0,(VkPipeline)TVar15);
  }
  if (local_3d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_3d0,local_3d8);
  }
  if (local_3b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_3b0,local_3b8);
  }
  if (local_4a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_4a0,local_4a8);
  }
  if (local_398.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_390,local_398);
  }
  if (local_378.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_370,local_378);
  }
  if (local_358.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_350,local_358);
  }
  (**(code **)(*(long *)uVar9 + 8))(uVar9);
  if (local_488.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_480,local_488);
  }
  if (local_338.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_330,local_338);
  }
  if (uVar8 != 0) {
    (**(code **)(*(long *)uVar8 + 8))(uVar8);
  }
  if (local_648.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_640,local_648);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const TestParams params)
{
	if (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType &&
		(!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1")))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const DeviceInterface&			vk						= context.getDeviceInterface();
	const InstanceInterface&		vki						= context.getInstanceInterface();
	const VkDevice					device					= context.getDevice();
	const VkPhysicalDevice			physDevice				= context.getPhysicalDevice();
	const deUint32					queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= context.getUniversalQueue();
	Allocator&						allocator				= context.getDefaultAllocator();

	checkGeometryShaderSupport(vki, physDevice);

	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const deUint32					numLayers				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? params.image.size.depth : params.image.numLayers);
	const Vec4						clearColor				= Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize				colorBufferSize			= params.image.size.width * params.image.size.height * params.image.size.depth * params.image.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const VkImageCreateFlags		imageCreateFlags		= (isCubeImageViewType(params.image.viewType) ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlagBits)0) |
															  (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_CREATE_2D_ARRAY_COMPATIBLE_BIT_KHR : (VkImageCreateFlagBits)0);
	const VkImageViewType			viewType				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_VIEW_TYPE_2D_ARRAY : params.image.viewType);

	const Unique<VkImage>			colorImage				(makeImage				(vk, device, makeImageCreateInfo(imageCreateFlags, getImageType(params.image.viewType), colorFormat, params.image.size,
																					 params.image.numLayers, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT)));
	const UniquePtr<Allocation>		colorImageAlloc			(bindImage				(vk, device, allocator, *colorImage, MemoryRequirement::Any));
	const Unique<VkImageView>		colorAttachment			(makeImageView			(vk, device, *colorImage, viewType, colorFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));

	const Unique<VkBuffer>			colorBuffer				(makeBuffer				(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc		(bindBuffer				(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	const Unique<VkShaderModule>	vertexModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	geometryModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("geom"), 0u));
	const Unique<VkShaderModule>	fragmentModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkRenderPass>		renderPass				(makeRenderPass			(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer		(vk, device, *renderPass, *colorAttachment, params.image.size.width,  params.image.size.height, numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout			(makePipelineLayout		(vk, device));
	const Unique<VkPipeline>		pipeline				(makeGraphicsPipeline	(vk, device, *pipelineLayout, *renderPass, *vertexModule, *geometryModule, *fragmentModule,
																					 makeExtent2D(params.image.size.width, params.image.size.height)));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool		(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer	(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	beginCommandBuffer(vk, *cmdBuffer);

	const VkClearValue			clearValue	= makeClearValueColor(clearColor);
	const VkRect2D				renderArea	=
	{
		makeOffset2D(0, 0),
		makeExtent2D(params.image.size.width, params.image.size.height),
	};
	const VkRenderPassBeginInfo renderPassBeginInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		*renderPass,									// VkRenderPass            renderPass;
		*framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		1u,												// uint32_t                clearValueCount;
		&clearValue,									// const VkClearValue*     pClearValues;
	};
	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Prepare color image for copy
	{
		const VkImageSubresourceRange	colorSubresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, params.image.numLayers);
		const VkImageMemoryBarrier		barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
				DE_NULL,										// const void*				pNext;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			outputMask;
				VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			inputMask;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
				VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout			newLayout;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
				*colorImage,									// VkImage					image;
				colorSubresourceRange,							// VkImageSubresourceRange	subresourceRange;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
	}
	// Color image -> host buffer
	{
		const VkBufferImageCopy region =
		{
			0ull,																						// VkDeviceSize                bufferOffset;
			0u,																							// uint32_t                    bufferRowLength;
			0u,																							// uint32_t                    bufferImageHeight;
			makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, params.image.numLayers),		// VkImageSubresourceLayers    imageSubresource;
			makeOffset3D(0, 0, 0),																		// VkOffset3D                  imageOffset;
			params.image.size,																			// VkExtent3D                  imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);
	}
	// Buffer write barrier
	{
		const VkBufferMemoryBarrier barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
				DE_NULL,										// const void*        pNext;
				VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
				VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
				*colorBuffer,									// VkBuffer           buffer;
				0ull,											// VkDeviceSize       offset;
				VK_WHOLE_SIZE,									// VkDeviceSize       size;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), colorBufferSize);

	if (!verifyResults(context.getTestContext().getLog(), params, colorFormat, colorBufferAlloc->getHostPtr()))
		return tcu::TestStatus::fail("Rendered images are incorrect");
	else
		return tcu::TestStatus::pass("OK");
}